

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

void __thiscall leveldb::BlockBuilder::Reset(BlockBuilder *this)

{
  value_type_conflict1 local_14;
  BlockBuilder *local_10;
  BlockBuilder *this_local;
  
  local_10 = this;
  std::__cxx11::string::clear();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->restarts_);
  local_14 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->restarts_,&local_14);
  this->counter_ = 0;
  this->finished_ = false;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void BlockBuilder::Reset() {
  buffer_.clear();
  restarts_.clear();
  restarts_.push_back(0);  // First restart point is at offset 0
  counter_ = 0;
  finished_ = false;
  last_key_.clear();
}